

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer_factory.cc
# Opt level: O2

unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
draco::FileWriterFactory::OpenWriter(string *file_name)

{
  pointer pp_Var1;
  vector<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  *pvVar2;
  pointer pp_Var3;
  
  pvVar2 = (anonymous_namespace)::GetFileWriterOpenFunctions_abi_cxx11_();
  pp_Var3 = (pvVar2->
            super__Vector_base<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pp_Var1 = (pvVar2->
            super__Vector_base<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pp_Var3 == pp_Var1) {
      fprintf(_stderr,"%s:%d (%s): %s.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/atteneder[P]draco/src/draco/io/file_writer_factory.cc"
              ,0x2a,"OpenWriter","No file writer able to open output");
      (file_name->_M_dataplus)._M_p = (pointer)0x0;
      return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
              )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
                )file_name;
    }
    (**pp_Var3)(file_name);
    if ((file_name->_M_dataplus)._M_p != (pointer)0x0) break;
    std::unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>::
    ~unique_ptr((unique_ptr<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>_>
                 *)file_name);
    pp_Var3 = pp_Var3 + 1;
  }
  return (__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
          )(__uniq_ptr_data<draco::FileWriterInterface,_std::default_delete<draco::FileWriterInterface>,_true,_true>
            )file_name;
}

Assistant:

std::unique_ptr<FileWriterInterface> FileWriterFactory::OpenWriter(
    const std::string &file_name) {
  for (auto open_function : *GetFileWriterOpenFunctions()) {
    auto writer = open_function(file_name);
    if (writer == nullptr) {
      continue;
    }
    return writer;
  }
  FILEWRITER_LOG_ERROR("No file writer able to open output");
  return nullptr;
}